

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2i.c
# Opt level: O2

Int2_Man_t * Int2_ManStart(sat_solver2 *pSat,int *pGloVars,int nGloVars)

{
  uint uVar1;
  Int2_Man_t *pIVar2;
  Vec_Int_t *pVVar3;
  int *__dest;
  Vec_Int_t *p;
  ulong uVar4;
  Gia_Man_t *p_00;
  char *pcVar5;
  Gia_Obj_t *pObj;
  ulong uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  bool bVar10;
  
  lVar9 = 1;
  pIVar2 = (Int2_Man_t *)calloc(1,0x20);
  pIVar2->pSat = pSat;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nSize = nGloVars;
  pVVar3->nCap = nGloVars;
  __dest = (int *)malloc((long)nGloVars << 2);
  pVVar3->pArray = __dest;
  memcpy(__dest,pGloVars,(long)nGloVars << 2);
  pIVar2->vGloVars = pVVar3;
  p = Vec_IntAlloc(0);
  iVar7 = 0;
  if ((long)pVVar3->nSize != 0) {
    iVar7 = *pVVar3->pArray;
    for (; lVar9 < pVVar3->nSize; lVar9 = lVar9 + 1) {
      iVar8 = pVVar3->pArray[lVar9];
      if (iVar7 <= iVar8) {
        iVar7 = iVar8;
      }
    }
    uVar1 = iVar7 + 1;
    Vec_IntGrow(p,uVar1);
    uVar4 = 0;
    uVar6 = 0;
    if (0 < (int)uVar1) {
      uVar6 = (ulong)uVar1;
    }
    for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      p->pArray[uVar4] = -1;
    }
    p->nSize = uVar1;
    for (iVar8 = 0; iVar8 < pVVar3->nSize; iVar8 = iVar8 + 1) {
      uVar1 = Vec_IntEntry(pVVar3,iVar8);
      if (uVar1 != 0xffffffff) {
        if (((int)uVar1 < 0) || (iVar7 < (int)uVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        p->pArray[uVar1] = iVar8;
      }
    }
    iVar7 = pVVar3->nSize * 10;
  }
  pIVar2->vVar2Glo = p;
  p_00 = Gia_ManStart(iVar7);
  pIVar2->pGia = p_00;
  pcVar5 = (char *)malloc(0xc);
  builtin_strncpy(pcVar5,"interpolant",0xc);
  iVar7 = 0;
  if (0 < nGloVars) {
    iVar7 = nGloVars;
  }
  p_00->pName = pcVar5;
  while (bVar10 = iVar7 != 0, iVar7 = iVar7 + -1, bVar10) {
    pObj = Gia_ManAppendObj(p_00);
    uVar4 = *(ulong *)pObj;
    *(ulong *)pObj = uVar4 | 0x9fffffff;
    *(ulong *)pObj =
         uVar4 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
    pVVar3 = p_00->vCis;
    iVar8 = Gia_ObjId(p_00,pObj);
    Vec_IntPush(pVVar3,iVar8);
    Gia_ObjId(p_00,pObj);
  }
  Gia_ManHashStart(p_00);
  return pIVar2;
}

Assistant:

Int2_Man_t * Int2_ManStart( sat_solver2 * pSat, int * pGloVars, int nGloVars )
{
    Int2_Man_t * p;
    int i;
    p = ABC_CALLOC( Int2_Man_t, 1 );
    p->pSat     = pSat;
    p->vGloVars = Vec_IntAllocArrayCopy( pGloVars, nGloVars );
    p->vVar2Glo = Vec_IntInvert( p->vGloVars, -1 );
    p->pGia     = Gia_ManStart( 10 * Vec_IntSize(p->vGloVars) );
    p->pGia->pName = Abc_UtilStrsav( "interpolant" );
    for ( i = 0; i < nGloVars; i++ )
        Gia_ManAppendCi( p->pGia );
    Gia_ManHashStart( p->pGia );
    return p;
}